

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O0

bool GenericModelPrivate::isVariantLessThan(QVariant *left,QVariant *right)

{
  double dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  QString local_90;
  QString local_78;
  QDateTime local_50 [8];
  QDateTime local_48 [8];
  int local_40;
  QTime local_3c;
  qint64 local_38;
  QDate local_30;
  char16_t local_24;
  QChar local_22;
  QVariant *local_20;
  QVariant *right_local;
  QVariant *left_local;
  
  local_20 = right;
  right_local = left;
  iVar2 = ::QVariant::userType(left);
  if (iVar2 == 0) {
    left_local._7_1_ = 0;
  }
  else {
    iVar2 = ::QVariant::userType(local_20);
    if (iVar2 == 0) {
      left_local._7_1_ = 1;
    }
    else {
      iVar2 = ::QVariant::userType(right_local);
      switch(iVar2) {
      case 2:
        iVar2 = ::QVariant::toInt((bool *)right_local);
        iVar3 = ::QVariant::toInt((bool *)local_20);
        left_local._7_1_ = iVar2 < iVar3;
        break;
      case 3:
        uVar4 = ::QVariant::toUInt((bool *)right_local);
        uVar5 = ::QVariant::toUInt((bool *)local_20);
        left_local._7_1_ = uVar4 < uVar5;
        break;
      case 4:
        lVar6 = ::QVariant::toLongLong((bool *)right_local);
        lVar7 = ::QVariant::toLongLong((bool *)local_20);
        left_local._7_1_ = lVar6 < lVar7;
        break;
      case 5:
        uVar8 = ::QVariant::toULongLong((bool *)right_local);
        uVar9 = ::QVariant::toULongLong((bool *)local_20);
        left_local._7_1_ = uVar8 < uVar9;
        break;
      case 6:
        dVar1 = (double)::QVariant::toDouble((bool *)right_local);
        dVar12 = (double)::QVariant::toDouble((bool *)local_20);
        left_local._7_1_ = dVar1 < dVar12;
        break;
      case 10:
      default:
        ::QVariant::toString();
        ::QVariant::toString();
        iVar2 = QString::compare((QString *)&local_78,(CaseSensitivity)&local_90);
        left_local._7_1_ = iVar2 < 0;
        QString::~QString(&local_90);
        QString::~QString(&local_78);
        break;
      case 0xe:
        local_30.jd = ::QVariant::toDate();
        local_38 = ::QVariant::toDate();
        left_local._7_1_ = operator<(local_30,(QDate)local_38);
        break;
      case 0xf:
        local_3c.mds = ::QVariant::toTime();
        local_40 = ::QVariant::toTime();
        left_local._7_1_ = operator<(local_3c,(QTime)local_40);
        break;
      case 0x10:
        ::QVariant::toDateTime();
        ::QVariant::toDateTime();
        left_local._7_1_ = operator<(local_48,local_50);
        QDateTime::~QDateTime(local_50);
        QDateTime::~QDateTime(local_48);
        break;
      case 0x22:
        local_22.ucs = ::QVariant::toChar();
        local_24 = ::QVariant::toChar();
        left_local._7_1_ = operator<(local_22,(QChar)local_24);
        break;
      case 0x26:
        fVar10 = (float)::QVariant::toFloat((bool *)right_local);
        fVar11 = (float)::QVariant::toFloat((bool *)local_20);
        left_local._7_1_ = fVar10 < fVar11;
      }
    }
  }
  return (bool)(left_local._7_1_ & 1);
}

Assistant:

bool GenericModelPrivate::isVariantLessThan(const QVariant &left, const QVariant &right)
{
    if (left.userType() == QMetaType::UnknownType)
        return false;
    if (right.userType() == QMetaType::UnknownType)
        return true;
    switch (left.userType()) {
    case QMetaType::Int:
        return left.toInt() < right.toInt();
    case QMetaType::UInt:
        return left.toUInt() < right.toUInt();
    case QMetaType::LongLong:
        return left.toLongLong() < right.toLongLong();
    case QMetaType::ULongLong:
        return left.toULongLong() < right.toULongLong();
    case QMetaType::Float:
        return left.toFloat() < right.toFloat();
    case QMetaType::Double:
        return left.toDouble() < right.toDouble();
    case QMetaType::Char:
        return left.toChar() < right.toChar();
    case QMetaType::QDate:
        return left.toDate() < right.toDate();
    case QMetaType::QTime:
        return left.toTime() < right.toTime();
    case QMetaType::QDateTime:
        return left.toDateTime() < right.toDateTime();
    case QMetaType::QString:
    default:
        return left.toString().compare(right.toString()) < 0;
    }
}